

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void update_b_sep_sym(int wiener_win,int64_t **Mc,int64_t **Hc,int32_t *a,int32_t *b)

{
  int n;
  int stride;
  int iVar1;
  int iVar2;
  int64_t iVar3;
  long lVar4;
  int32_t *in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int64_t x;
  int l;
  int k;
  int jj;
  int ii_1;
  int ii;
  int wiener_halfwin1;
  int wiener_win2;
  int32_t a2 [7];
  int32_t a1 [7];
  int64_t B [16];
  int64_t A [4];
  int64_t S [7];
  int j;
  int i;
  undefined4 local_180;
  undefined4 local_178;
  int local_164;
  int local_160;
  int32_t local_148 [8];
  int32_t local_128 [8];
  int64_t local_108 [16];
  int64_t local_88 [4];
  int64_t local_68 [7];
  int local_30;
  int local_2c;
  long local_28;
  int32_t *local_20;
  long local_18;
  long local_10;
  int local_4;
  
  n = in_EDI >> 1;
  stride = n + 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  memset(local_88,0,0x20);
  memset(local_108,0,0x80);
  for (local_2c = 0; local_2c < local_4; local_2c = local_2c + 1) {
    iVar1 = wrap_index(local_2c,local_4);
    for (local_30 = 0; local_30 < local_4; local_30 = local_30 + 1) {
      local_88[iVar1] =
           (*(long *)(*(long *)(local_10 + (long)local_2c * 8) + (long)local_30 * 8) *
           (long)local_20[local_30]) / 0x10000 + local_88[iVar1];
    }
  }
  split_wiener_filter_coefficients(local_4,local_20,local_128,local_148);
  for (local_2c = 0; local_2c < local_4; local_2c = local_2c + 1) {
    iVar1 = wrap_index(local_2c,local_4);
    for (local_30 = 0; local_30 < local_4; local_30 = local_30 + 1) {
      iVar2 = wrap_index(local_30,local_4);
      for (local_160 = 0; local_160 < local_4; local_160 = local_160 + 1) {
        for (local_164 = 0; local_164 < local_4; local_164 = local_164 + 1) {
          iVar3 = multiply_and_scale((*(long *)(*(long *)(local_18 +
                                                         (long)(local_2c * local_4 + local_30) * 8)
                                               + (long)(local_160 * in_EDI * in_EDI + local_164) * 8
                                               ) * (long)local_20[local_160]) / 0x10000,
                                     local_128[local_164],local_148[local_164]);
          lVar4 = (long)(iVar2 * stride + iVar1);
          local_88[lVar4 + -0x10] = iVar3 + local_88[lVar4 + -0x10];
        }
      }
    }
  }
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    local_88[local_2c] =
         local_88[local_2c] -
         (local_88[n] * 2 + local_88[(long)(local_2c * stride + stride + -1) + -0x10] +
         local_88[(long)(n * stride + n) + -0x10] * -2);
  }
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
      lVar4 = (long)(local_2c * stride + local_30);
      local_88[lVar4 + -0x10] =
           local_88[lVar4 + -0x10] +
           (local_88[(long)(local_2c * stride + n) + -0x10] +
            local_88[(long)(n * stride + local_30) + -0x10] +
           local_88[(long)(n * stride + n) + -0x10] * -2) * -2;
    }
  }
  iVar1 = linsolve_wiener(n,local_108,stride,local_88,local_68);
  if (iVar1 != 0) {
    local_68[n] = 0x10000;
    for (local_2c = stride; local_2c < local_4; local_2c = local_2c + 1) {
      local_68[local_2c] = local_68[(local_4 + -1) - local_2c];
      local_68[n] = local_68[n] + local_68[local_2c] * -2;
    }
    for (local_2c = 0; local_2c < local_4; local_2c = local_2c + 1) {
      if (local_68[local_2c] < -0x20000000) {
        local_178 = 0xe0000000;
      }
      else {
        if (local_68[local_2c] < 0x20000000) {
          local_180 = (undefined4)local_68[local_2c];
        }
        else {
          local_180 = 0x1fffffff;
        }
        local_178 = local_180;
      }
      *(undefined4 *)(local_28 + (long)local_2c * 4) = local_178;
    }
  }
  return;
}

Assistant:

static inline void update_b_sep_sym(int wiener_win, int64_t **Mc, int64_t **Hc,
                                    const int32_t *a, int32_t *b) {
  int i, j;
  int64_t S[WIENER_WIN];
  int64_t A[WIENER_HALFWIN1], B[WIENER_HALFWIN1 * WIENER_HALFWIN1];
  int32_t a1[WIENER_WIN], a2[WIENER_WIN];
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin1 = (wiener_win >> 1) + 1;
  memset(A, 0, sizeof(A));
  memset(B, 0, sizeof(B));
  for (i = 0; i < wiener_win; i++) {
    const int ii = wrap_index(i, wiener_win);
    for (j = 0; j < wiener_win; j++) {
      A[ii] += Mc[i][j] * a[j] / WIENER_TAP_SCALE_FACTOR;
    }
  }
  split_wiener_filter_coefficients(wiener_win, a, a1, a2);

  for (i = 0; i < wiener_win; i++) {
    const int ii = wrap_index(i, wiener_win);
    for (j = 0; j < wiener_win; j++) {
      const int jj = wrap_index(j, wiener_win);
      int k, l;
      for (k = 0; k < wiener_win; ++k) {
        for (l = 0; l < wiener_win; ++l) {
          // Calculate
          // B[jj * wiener_halfwin1 + ii] +=
          //     Hc[i * wiener_win + j][k * wiener_win2 + l] * a[k] /
          //     WIENER_TAP_SCALE_FACTOR * a[l] / WIENER_TAP_SCALE_FACTOR;
          //
          // The last multiplication may overflow, so we combine the last
          // multiplication with the last division.
          const int64_t x = Hc[i * wiener_win + j][k * wiener_win2 + l] * a[k] /
                            WIENER_TAP_SCALE_FACTOR;
          // a[l] = a1[l] * WIENER_TAP_SCALE_FACTOR + a2[l]
          B[jj * wiener_halfwin1 + ii] += multiply_and_scale(x, a1[l], a2[l]);
        }
      }
    }
  }
  // Normalization enforcement in the system of equations itself
  for (i = 0; i < wiener_halfwin1 - 1; ++i) {
    A[i] -=
        A[wiener_halfwin1 - 1] * 2 +
        B[i * wiener_halfwin1 + wiener_halfwin1 - 1] -
        2 * B[(wiener_halfwin1 - 1) * wiener_halfwin1 + (wiener_halfwin1 - 1)];
  }
  for (i = 0; i < wiener_halfwin1 - 1; ++i) {
    for (j = 0; j < wiener_halfwin1 - 1; ++j) {
      B[i * wiener_halfwin1 + j] -=
          2 * (B[i * wiener_halfwin1 + (wiener_halfwin1 - 1)] +
               B[(wiener_halfwin1 - 1) * wiener_halfwin1 + j] -
               2 * B[(wiener_halfwin1 - 1) * wiener_halfwin1 +
                     (wiener_halfwin1 - 1)]);
    }
  }
  if (linsolve_wiener(wiener_halfwin1 - 1, B, wiener_halfwin1, A, S)) {
    S[wiener_halfwin1 - 1] = WIENER_TAP_SCALE_FACTOR;
    for (i = wiener_halfwin1; i < wiener_win; ++i) {
      S[i] = S[wiener_win - 1 - i];
      S[wiener_halfwin1 - 1] -= 2 * S[i];
    }
    for (i = 0; i < wiener_win; ++i) {
      b[i] = (int32_t)CLIP(S[i], -(1 << (WIENER_FILT_BITS - 1)),
                           (1 << (WIENER_FILT_BITS - 1)) - 1);
    }
  }
}